

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

GraphicsPipelineStateCreateInfoX * __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
::AddSignature(PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
               *this,IPipelineResourceSignature *pSignature)

{
  Char *pCVar1;
  IPipelineResourceSignature **ppIVar2;
  char (*Args_1) [57];
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  IPipelineResourceSignature *pSignature_local;
  PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  *this_local;
  
  msg.field_2._8_8_ = pSignature;
  if (pSignature == (IPipelineResourceSignature *)0x0) {
    FormatString<char[27]>((string *)local_40,(char (*) [27])"Signature must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"AddSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/interface/GraphicsTypesX.hpp"
               ,0x510);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    std::
    vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
    ::emplace_back<Diligent::IPipelineResourceSignature*&>
              ((vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
                *)&this->Signatures,(IPipelineResourceSignature **)((long)&msg.field_2 + 8));
    ppIVar2 = std::
              vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
              ::data(&this->Signatures);
    (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures
         = ppIVar2;
    Args_1 = (char (*) [57])
             std::
             vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
             ::size(&this->Signatures);
    (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.
    ResourceSignaturesCount = (Uint32)Args_1;
    if (8 < (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.
            ResourceSignaturesCount) {
      FormatString<char[26],char[57]>
                ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"this->ResourceSignaturesCount <= MAX_RESOURCE_SIGNATURES",Args_1);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"AddSignature",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/interface/GraphicsTypesX.hpp"
                 ,0x517);
      std::__cxx11::string::~string((string *)local_70);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IPipelineResourceSignature*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&this->Objects,(IPipelineResourceSignature **)((long)&msg.field_2 + 8));
  }
  return (GraphicsPipelineStateCreateInfoX *)this;
}

Assistant:

DerivedType& AddSignature(IPipelineResourceSignature* pSignature)
    {
        if (pSignature == nullptr)
        {
            UNEXPECTED("Signature must not be null");
            return static_cast<DerivedType&>(*this);
        }

        Signatures.emplace_back(pSignature);
        this->ppResourceSignatures    = Signatures.data();
        this->ResourceSignaturesCount = static_cast<Uint32>(Signatures.size());
        VERIFY_EXPR(this->ResourceSignaturesCount <= MAX_RESOURCE_SIGNATURES);
        Objects.emplace_back(pSignature);

        return static_cast<DerivedType&>(*this);
    }